

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bit_field.cpp
# Opt level: O3

void __thiscall BitField_OneBitBoolean_Test::TestBody(BitField_OneBitBoolean_Test *this)

{
  return;
}

Assistant:

TEST (BitField, OneBitBoolean) {
    union {
        std::uint8_t v;
        pstore::bit_field<std::uint8_t, 3, 1> f1;
    };
    v = 0U;
    f1 = true;
    EXPECT_TRUE (f1.value ());
    EXPECT_TRUE (static_cast<bool> (f1));
    f1 = false;
    EXPECT_FALSE (f1.value ());
    EXPECT_FALSE (static_cast<bool> (f1));
}